

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O1

_Bool borg_refuel_lantern(void)

{
  wchar_t wVar1;
  char *what;
  
  wVar1 = borg_slot(L'\x1b',sv_flask_oil);
  if (((wVar1 < L'\0') && (wVar1 = borg_slot(L'\x13',sv_light_lantern), L'\xffffffff' < wVar1)) &&
     (borg_items[(uint)wVar1].timeout < 1)) {
    wVar1 = L'\xffffffff';
  }
  if ((L'\xffffffff' < wVar1) &&
     (sv_light_lantern == (uint)borg_items[(ulong)z_info->pack_size + 5].sval)) {
    what = format("# Refueling with %s.",borg_items + (uint)wVar1);
    borg_note(what);
    borg_keypress(0x46);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(uint)wVar1]);
    goal_shop = -1;
    goal_ware = -1;
    goal_item = -1;
    return true;
  }
  return false;
}

Assistant:

bool borg_refuel_lantern(void)
{
    int i;

    /* Look for a flask of oil */
    i = borg_slot(TV_FLASK, sv_flask_oil);

    /* None available check for lantern */
    if (i < 0) {
        i = borg_slot(TV_LIGHT, sv_light_lantern);

        /* It better have some oil left */
        if (i >= 0 && borg_items[i].timeout <= 0)
            i = -1;
    }

    /* Still none */
    if (i < 0)
        return (false);

    /* Cant refuel a torch with oil */
    if (borg_items[INVEN_LIGHT].sval != sv_light_lantern) {
        return (false);
    }

    /* Log the message */
    borg_note(format("# Refueling with %s.", borg_items[i].desc));

    /* Perform the action */
    borg_keypress('F');
    borg_keypress(all_letters_nohjkl[i]);

    /* Hack -- Clear "shop" goals */
    goal_shop = goal_ware = goal_item = -1;

    /* Success */
    return (true);
}